

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall gl3cts::TransformFeedback::APIErrors::testExtension2(APIErrors *this)

{
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined4 *puVar8;
  MessageBuilder local_10b8;
  MessageBuilder local_f38;
  short local_db2;
  undefined1 local_db0 [6];
  unsigned_short invalid_name;
  MessageBuilder local_c30;
  MessageBuilder local_ab0;
  MessageBuilder local_930;
  MessageBuilder local_7b0;
  MessageBuilder local_630;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  long local_20;
  Functions *gl;
  APIErrors *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar2);
  (**(code **)(local_20 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"glBindTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x3cb);
  (**(code **)(local_20 + 0xfe0))();
  iVar2 = (**(code **)(local_20 + 0x800))();
  if (iVar2 == 0x502) {
    (**(code **)(local_20 + 0x1248))();
    iVar2 = (**(code **)(local_20 + 0x800))();
    if (iVar2 == 0x502) {
      (**(code **)(local_20 + 0x1680))(this->m_program_id_with_output);
      dVar3 = (**(code **)(local_20 + 0x800))();
      glu::checkError(dVar3,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x3ee);
      (**(code **)(local_20 + 0x48))(0x8c8e,0,this->m_buffer_0);
      dVar3 = (**(code **)(local_20 + 0x800))();
      glu::checkError(dVar3,"glBindBufferBase call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x3f2);
      (**(code **)(local_20 + 0x5b0))(0,this->m_transform_feedback_object_0);
      iVar2 = (**(code **)(local_20 + 0x800))();
      if (iVar2 == 0x502) {
        (**(code **)(local_20 + 0x30))(0);
        dVar3 = (**(code **)(local_20 + 0x800))();
        glu::checkError(dVar3,"glBeginTransformFeedback call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x405);
        (**(code **)(local_20 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
        iVar2 = (**(code **)(local_20 + 0x800))();
        if (iVar2 == 0x502) {
          (**(code **)(local_20 + 0x488))(1,&this->m_transform_feedback_object_0);
          iVar2 = (**(code **)(local_20 + 0x800))();
          if (iVar2 == 0x502) {
            (**(code **)(local_20 + 0x1248))();
            iVar2 = (**(code **)(local_20 + 0x800))();
            if (iVar2 == 0x502) {
              (**(code **)(local_20 + 0xfe0))();
              dVar3 = (**(code **)(local_20 + 0x800))();
              glu::checkError(dVar3,"glPauseTransformFeedback call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                              ,0x43e);
              (**(code **)(local_20 + 0x538))(1,0,2);
              iVar2 = (**(code **)(local_20 + 0x800))();
              if (iVar2 == 0) {
                (**(code **)(local_20 + 0xce8))(this->m_program_id_with_output);
                iVar2 = (**(code **)(local_20 + 0x800))();
                if (iVar2 == 0x502) {
                  (**(code **)(local_20 + 0x1680))(0);
                  iVar2 = (**(code **)(local_20 + 0x800))();
                  if (iVar2 == 0) {
                    (**(code **)(local_20 + 0x1680))(this->m_program_id_with_output);
                    dVar3 = (**(code **)(local_20 + 0x800))();
                    glu::checkError(dVar3,"glUseProgram call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x473);
                    (**(code **)(local_20 + 0x638))();
                    dVar3 = (**(code **)(local_20 + 0x800))();
                    glu::checkError(dVar3,"glEndTransformFeedback call failed.",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                    ,0x478);
                    local_db2 = 1;
                    while (cVar1 = (**(code **)(local_20 + 0xcd0))(local_db2), cVar1 != '\0') {
                      local_db2 = local_db2 + 1;
                      if (local_db2 == -1) {
                        pTVar5 = deqp::Context::getTestContext(this->m_context);
                        pTVar6 = tcu::TestContext::getLog(pTVar5);
                        tcu::TestLog::operator<<
                                  (&local_f38,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                        pMVar7 = tcu::MessageBuilder::operator<<
                                           (&local_f38,
                                            (char (*) [46])
                                            "Cannot find unused trnasform feedback object.");
                        tcu::MessageBuilder::operator<<
                                  (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        tcu::MessageBuilder::~MessageBuilder(&local_f38);
                        puVar8 = (undefined4 *)__cxa_allocate_exception(4);
                        *puVar8 = 0;
                        __cxa_throw(puVar8,&int::typeinfo,0);
                      }
                    }
                    (**(code **)(local_20 + 0x5b0))(0,local_db2);
                    iVar2 = (**(code **)(local_20 + 0x800))();
                    if (iVar2 == 0x501) {
                      this_local._7_1_ = true;
                    }
                    else {
                      (**(code **)(local_20 + 0x638))();
                      pTVar5 = deqp::Context::getTestContext(this->m_context);
                      pTVar6 = tcu::TestContext::getLog(pTVar5);
                      tcu::TestLog::operator<<
                                (&local_10b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                      pMVar7 = tcu::MessageBuilder::operator<<
                                         (&local_10b8,
                                          (char (*) [68])
                                          "glUseProgram unexpectedly failed when transform feedback is paused."
                                         );
                      tcu::MessageBuilder::operator<<
                                (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                      tcu::MessageBuilder::~MessageBuilder(&local_10b8);
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    (**(code **)(local_20 + 0x638))();
                    pTVar5 = deqp::Context::getTestContext(this->m_context);
                    pTVar6 = tcu::TestContext::getLog(pTVar5);
                    tcu::TestLog::operator<<
                              ((MessageBuilder *)local_db0,pTVar6,
                               (BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar7 = tcu::MessageBuilder::operator<<
                                       ((MessageBuilder *)local_db0,
                                        (char (*) [68])
                                        "glUseProgram unexpectedly failed when transform feedback is paused."
                                       );
                    tcu::MessageBuilder::operator<<
                              (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_db0);
                    this_local._7_1_ = false;
                  }
                }
                else {
                  pTVar5 = deqp::Context::getTestContext(this->m_context);
                  pTVar6 = tcu::TestContext::getLog(pTVar5);
                  tcu::TestLog::operator<<
                            (&local_c30,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar7 = tcu::MessageBuilder::operator<<
                                     (&local_c30,
                                      (char (*) [139])
                                      "INVALID_OPERATION was not generated by LinkProgram when <program> was used by some transform feedback object that is currently not active."
                                     );
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_c30);
                  (**(code **)(local_20 + 0x638))();
                  this_local._7_1_ = false;
                }
              }
              else {
                (**(code **)(local_20 + 0x638))();
                pTVar5 = deqp::Context::getTestContext(this->m_context);
                pTVar6 = tcu::TestContext::getLog(pTVar5);
                tcu::TestLog::operator<<
                          (&local_ab0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (&local_ab0,
                                    (char (*) [110])
                                    "No error is not generated by draw command when transform feedback is paused and primitive modes do not match."
                                   );
                tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_ab0);
                this_local._7_1_ = false;
              }
            }
            else {
              (**(code **)(local_20 + 0x638))();
              pTVar5 = deqp::Context::getTestContext(this->m_context);
              pTVar6 = tcu::TestContext::getLog(pTVar5);
              tcu::TestLog::operator<<
                        (&local_930,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_930,
                                  (char (*) [111])
                                  "INVALID_OPERATION is not generated by ResumeTransformFeedback if current transform feedback is not not paused."
                                 );
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_930);
              this_local._7_1_ = false;
            }
          }
          else {
            (**(code **)(local_20 + 0x638))();
            pTVar5 = deqp::Context::getTestContext(this->m_context);
            pTVar6 = tcu::TestContext::getLog(pTVar5);
            tcu::TestLog::operator<<(&local_7b0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (&local_7b0,
                                (char (*) [90])
                                "INVALID_OPERATION is not generated by DeleteTransformFeedbacks if any of <ids> is active."
                               );
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_7b0);
            this_local._7_1_ = false;
          }
        }
        else {
          (**(code **)(local_20 + 0x638))();
          pTVar5 = deqp::Context::getTestContext(this->m_context);
          pTVar6 = tcu::TestContext::getLog(pTVar5);
          tcu::TestLog::operator<<(&local_630,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_630,
                              (char (*) [116])
                              "INVALID_OPERATION is not generated by BindTransformFeedback if current transform feedback is active and not paused."
                             );
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_630);
          this_local._7_1_ = false;
        }
      }
      else {
        pTVar5 = deqp::Context::getTestContext(this->m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar5);
        tcu::TestLog::operator<<(&local_4b0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_4b0,
                            (char (*) [130])
                            "INVALID_OPERATION is not generated by DrawTransformFeedback when EndTransformFeedback was never called for the object named <id>."
                           );
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4b0);
        this_local._7_1_ = false;
      }
    }
    else {
      pTVar5 = deqp::Context::getTestContext(this->m_context);
      pTVar6 = tcu::TestContext::getLog(pTVar5);
      tcu::TestLog::operator<<(&local_330,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_330,
                          (char (*) [107])
                          "INVALID_OPERATION is not generated by ResumeTransformFeedback if current transform feedback is not active."
                         );
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_330);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar5 = deqp::Context::getTestContext(this->m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1a0,
                        (char (*) [116])
                        "INVALID_OPERATION is not generated by PauseTransformFeedback if current transform feedback is not active or paused."
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool gl3cts::TransformFeedback::APIErrors::testExtension2(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  Bind Transform Feedback Object */
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	/*  INVALID_OPERATION is generated by PauseTransformFeedback if current
	 transform feedback is not active or paused; */

	gl.pauseTransformFeedback();

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by PauseTransformFeedback if "
											   "current transform feedback is not active or paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by ResumeTransformFeedback if current
	 transform feedback is not active; */

	gl.resumeTransformFeedback();

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by ResumeTransformFeedback if "
											   "current transform feedback is not active."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  Prepare program and buffer. */
	gl.useProgram(m_program_id_with_output);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase call failed.");

	/*  INVALID_OPERATION is generated by DrawTransformFeedback when
	 EndTransformFeedback was never called for the object named <id>. */
	gl.drawTransformFeedback(GL_POINTS, m_transform_feedback_object_0);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by DrawTransformFeedback when "
											   "EndTransformFeedback was never called for the object named <id>."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  Make Transform Feedback Active */
	gl.beginTransformFeedback(GL_POINTS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/*  INVALID_OPERATION is generated by BindTransformFeedback if current
	 transform feedback is active and not paused; */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by BindTransformFeedback if current "
											   "transform feedback is active and not paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by DeleteTransformFeedbacks if any of <ids>
	 is active; */

	gl.deleteTransformFeedbacks(1, &m_transform_feedback_object_0);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "INVALID_OPERATION is not generated by DeleteTransformFeedbacks if any of <ids> is active."
			<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by ResumeTransformFeedback if current
	 transform feedback is not not paused; */

	gl.resumeTransformFeedback();

	if (GL_INVALID_OPERATION != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by ResumeTransformFeedback if "
											   "current transform feedback is not not paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  pause transform feedback */

	gl.pauseTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback call failed.");

	/*  No error is generated by draw command when transform feedback is paused
	 and primitive modes do not match; */

	gl.drawArrays(GL_LINES, 0, 2);

	if (GL_NO_ERROR != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "No error is not generated by draw command when transform feedback is "
											   "paused and primitive modes do not match."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by LinkProgram when <program> is used by
	 some transform feedback object that is currently not active; */

	gl.linkProgram(m_program_id_with_output);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION was not generated by LinkProgram when <program> was "
											   "used by some transform feedback object that is currently not active."
											<< tcu::TestLog::EndMessage;

		gl.endTransformFeedback();

		return false;
	}

	/*  No error is generated by UseProgram when transform feedback is paused; */

	gl.useProgram(0);

	if (GL_NO_ERROR != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glUseProgram unexpectedly failed when transform feedback is paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.useProgram(m_program_id_with_output);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	/*  End Transform Feedback and make draw. */

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/*  INVALID_VALUE is generated by DrawTransformFeedback if <id> is not name of
	 transform feedback object; */

	unsigned short int invalid_name = 1;

	while (gl.isTransformFeedback(invalid_name))
	{
		++invalid_name;

		/* Make sure that this loop ends someday, bad day. */
		if (invalid_name == USHRT_MAX)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Cannot find unused trnasform feedback object." << tcu::TestLog::EndMessage;
			throw 0;
		}
	}

	gl.drawTransformFeedback(GL_POINTS, (glw::GLuint)invalid_name);

	if (GL_INVALID_VALUE != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glUseProgram unexpectedly failed when transform feedback is paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}